

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O3

void __thiscall chrono::collision::CHAABB::CHAABB(CHAABB *this)

{
  double dVar1;
  
  *(undefined8 *)((long)(this->To).m_data + 0x14) = 0;
  *(undefined8 *)((long)(this->d).m_data + 4) = 0;
  *(undefined8 *)((long)(this->d).m_data + 0xc) = 0;
  *(undefined8 *)((long)(this->d).m_data + 0x14) = 0;
  (this->To).m_data[0] = 0.0;
  (this->To).m_data[1] = 0.0;
  (this->To).m_data[2] = 0.0;
  (this->d).m_data[0] = 0.0;
  if (this != (CHAABB *)&VNULL) {
    (this->To).m_data[0] = VNULL;
    (this->To).m_data[1] = DAT_00b689a0;
    (this->To).m_data[2] = DAT_00b689a8;
  }
  dVar1 = DAT_00b689a0;
  if (this != (CHAABB *)(Q_FLIP_AROUND_Z + 0x10)) {
    (this->d).m_data[0] = VNULL;
    (this->d).m_data[1] = dVar1;
    (this->d).m_data[2] = DAT_00b689a8;
  }
  return;
}

Assistant:

inline ChVector<Real>::ChVector() {
    m_data[0] = 0;
    m_data[1] = 0;
    m_data[2] = 0;
}